

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::poppify(Poppifier *this,Expression *expr)

{
  undefined1 local_100 [8];
  Poppifier poppifier;
  Expression *expr_local;
  Poppifier *this_local;
  
  poppifier.builder.wasm = (Module *)expr;
  wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::Poppifier(wasm::
  Builder__((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)local_100,&this->builder);
  Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::walk
            ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)local_100,
             (Expression **)&poppifier.builder);
  poppify::Poppifier::~Poppifier((Poppifier *)local_100);
  return;
}

Assistant:

void Poppifier::poppify(Expression* expr) {
  struct Poppifier : PostWalker<Poppifier> {
    bool scanned = false;
    Builder builder;
    Poppifier(Builder& builder) : builder(builder) {}

    static void scan(Poppifier* self, Expression** currp) {
      if (!self->scanned) {
        self->scanned = true;
        PostWalker<Poppifier>::scan(self, currp);
      } else {
        *currp = self->builder.makePop((*currp)->type);
      }
    }
  } poppifier(builder);
  poppifier.walk(expr);
}